

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswClass.c
# Opt level: O0

Ssw_Cla_t * Ssw_ClassesPreparePairsSimple(Aig_Man_t *pMiter,Vec_Int_t *vPairs)

{
  int iVar1;
  int iVar2;
  Ssw_Cla_t *p_00;
  Aig_Obj_t **ppAVar3;
  Aig_Obj_t *pObj_00;
  Aig_Obj_t *pObj_01;
  int local_3c;
  int i;
  Aig_Obj_t *pRepr;
  Aig_Obj_t *pObj;
  Aig_Obj_t **ppClassNew;
  Ssw_Cla_t *p;
  Vec_Int_t *vPairs_local;
  Aig_Man_t *pMiter_local;
  
  p_00 = Ssw_ClassesStart(pMiter);
  iVar1 = Vec_IntSize(vPairs);
  ppAVar3 = (Aig_Obj_t **)malloc((long)iVar1 << 3);
  p_00->pMemClasses = ppAVar3;
  local_3c = 0;
  while( true ) {
    iVar1 = Vec_IntSize(vPairs);
    if (iVar1 <= local_3c) {
      p_00->pMemClassesFree = (Aig_Obj_t **)0x0;
      Ssw_ClassesCheck(p_00);
      return p_00;
    }
    iVar1 = Vec_IntEntry(vPairs,local_3c);
    pObj_00 = Aig_ManObj(pMiter,iVar1);
    iVar1 = Vec_IntEntry(vPairs,local_3c + 1);
    pObj_01 = Aig_ManObj(pMiter,iVar1);
    iVar1 = Aig_ObjId(pObj_00);
    iVar2 = Aig_ObjId(pObj_01);
    if (iVar2 <= iVar1) break;
    Aig_ObjSetRepr(pMiter,pObj_01,pObj_00);
    ppAVar3 = p_00->pMemClasses + local_3c;
    *ppAVar3 = pObj_00;
    ppAVar3[1] = pObj_01;
    Ssw_ObjAddClass(p_00,pObj_00,ppAVar3,2);
    local_3c = local_3c + 2;
  }
  __assert_fail("Aig_ObjId(pRepr) < Aig_ObjId(pObj)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/ssw/sswClass.c"
                ,0x3af,"Ssw_Cla_t *Ssw_ClassesPreparePairsSimple(Aig_Man_t *, Vec_Int_t *)");
}

Assistant:

Ssw_Cla_t * Ssw_ClassesPreparePairsSimple( Aig_Man_t * pMiter, Vec_Int_t * vPairs )
{
    Ssw_Cla_t * p;
    Aig_Obj_t ** ppClassNew;
    Aig_Obj_t * pObj, * pRepr;
    int i;
    // start the classes
    p = Ssw_ClassesStart( pMiter );
    // allocate memory for classes
    p->pMemClasses = ABC_ALLOC( Aig_Obj_t *, Vec_IntSize(vPairs) );
    // create classes
    for ( i = 0; i < Vec_IntSize(vPairs); i += 2 )
    {
        pRepr = Aig_ManObj( pMiter, Vec_IntEntry(vPairs, i) );
        pObj  = Aig_ManObj( pMiter, Vec_IntEntry(vPairs, i+1) );
        assert( Aig_ObjId(pRepr) < Aig_ObjId(pObj) );
        Aig_ObjSetRepr( pMiter, pObj, pRepr );
        // get room for storing the class
        ppClassNew = p->pMemClasses + i;
        ppClassNew[0] = pRepr;
        ppClassNew[1] = pObj;
        // create new class
        Ssw_ObjAddClass( p, pRepr, ppClassNew, 2 );
    }
    // prepare room for new classes
    p->pMemClassesFree = NULL;
    Ssw_ClassesCheck( p );
//    Ssw_ClassesPrint( p, 0 );
    return p;
}